

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O0

int TvCtrlPointRemoveDevice(char *UDN)

{
  int iVar1;
  TvDeviceNode *local_20;
  TvDeviceNode *prevdevnode;
  TvDeviceNode *curdevnode;
  char *UDN_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&DeviceListMutex);
  local_20 = GlobalDeviceList;
  if (GlobalDeviceList == (TvDeviceNode *)0x0) {
    SampleUtil_Print("WARNING: TvCtrlPointRemoveDevice: Device list empty\n");
  }
  else {
    iVar1 = strcmp((char *)GlobalDeviceList,UDN);
    if (iVar1 == 0) {
      GlobalDeviceList = local_20->next;
      TvCtrlPointDeleteNode(local_20);
    }
    else {
      for (prevdevnode = local_20->next; prevdevnode != (TvDeviceNode *)0x0;
          prevdevnode = prevdevnode->next) {
        iVar1 = strcmp((char *)prevdevnode,UDN);
        if (iVar1 == 0) {
          local_20->next = prevdevnode->next;
          TvCtrlPointDeleteNode(prevdevnode);
          break;
        }
        local_20 = prevdevnode;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&DeviceListMutex);
  return 0;
}

Assistant:

int TvCtrlPointRemoveDevice(const char *UDN)
{
	struct TvDeviceNode *curdevnode;
	struct TvDeviceNode *prevdevnode;

	ithread_mutex_lock(&DeviceListMutex);

	curdevnode = GlobalDeviceList;
	if (!curdevnode) {
		SampleUtil_Print("WARNING: TvCtrlPointRemoveDevice: Device "
				 "list empty\n");
	} else {
		if (0 == strcmp(curdevnode->device.UDN, UDN)) {
			GlobalDeviceList = curdevnode->next;
			TvCtrlPointDeleteNode(curdevnode);
		} else {
			prevdevnode = curdevnode;
			curdevnode = curdevnode->next;
			while (curdevnode) {
				if (strcmp(curdevnode->device.UDN, UDN) == 0) {
					prevdevnode->next = curdevnode->next;
					TvCtrlPointDeleteNode(curdevnode);
					break;
				}
				prevdevnode = curdevnode;
				curdevnode = curdevnode->next;
			}
		}
	}

	ithread_mutex_unlock(&DeviceListMutex);

	return TV_SUCCESS;
}